

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O1

bool iDynTree::vector4FromString(string *vector_str,Vector4 *out)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> rgba;
  string errStr_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  double newDouble;
  string errStr;
  double *local_2a8;
  iterator iStack_2a0;
  double *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  string *local_228;
  Vector4 *local_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = (double *)0x0;
  local_2a8 = (double *)0x0;
  iStack_2a0._M_current = (double *)0x0;
  local_228 = vector_str;
  local_220 = out;
  splitString(vector_str,&local_268);
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(local_268.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar6));
      if (iVar2 != 0) {
        bVar1 = stringToDoubleWithClassicLocale
                          (local_268.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar6,(double *)&local_248);
        if (bVar1) {
          if (iStack_2a0._M_current == local_298) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_2a8,iStack_2a0,
                       (double *)&local_248);
          }
          else {
            *iStack_2a0._M_current = (double)local_248;
            iStack_2a0._M_current = iStack_2a0._M_current + 1;
          }
        }
        else {
          std::operator+(&local_288,"Unable to parse component [",
                         local_268.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar6);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_1a8 = *plVar4;
            lStack_1a0 = plVar3[3];
            local_1b8 = &local_1a8;
          }
          else {
            local_1a8 = *plVar4;
            local_1b8 = (long *)*plVar3;
          }
          local_1b0 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          iDynTree::reportError("","vector4FromString",(char *)local_1b8);
          if (local_1b8 != &local_1a8) {
            operator_delete(local_1b8,local_1a8 + 1);
          }
        }
        if (!bVar1) goto LAB_00134def;
      }
      bVar1 = uVar7 < (ulong)((long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar1);
  }
  if ((long)iStack_2a0._M_current - (long)local_2a8 == 0x20) {
    local_220->m_data[0] = *local_2a8;
    local_220->m_data[1] = local_2a8[1];
    local_220->m_data[2] = local_2a8[2];
    local_220->m_data[3] = local_2a8[3];
    bVar1 = true;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x137ff6);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_208 = *plVar4;
      lStack_200 = plVar3[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *plVar4;
      local_218 = (long *)*plVar3;
    }
    local_210 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_218);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_1e8 = *plVar4;
      lStack_1e0 = plVar3[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *plVar4;
      local_1f8 = (long *)*plVar3;
    }
    local_1f0 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1f8,(ulong)(local_228->_M_dataplus)._M_p);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_238 = *plVar4;
      lStack_230 = plVar3[3];
      local_248 = &local_238;
    }
    else {
      local_238 = *plVar4;
      local_248 = (long *)*plVar3;
    }
    local_240 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_288.field_2._M_allocated_capacity = *psVar5;
      local_288.field_2._8_8_ = plVar3[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar5;
      local_288._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_288._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8,local_1e8 + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208 + 1);
    }
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0],local_1c8[0] + 1);
    }
    iDynTree::reportError("","vector4FromString",local_288._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
LAB_00134def:
    bVar1 = false;
  }
  if (local_2a8 != (double *)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return bVar1;
}

Assistant:

bool inline vector4FromString(const std::string & vector_str, Vector4 & out)
{
    std::vector<std::string> pieces;
    std::vector<double> rgba;
    splitString(vector_str,pieces);
    for (unsigned int i = 0; i < pieces.size(); ++i)
    {
      if (pieces[i] != ""){
       double newDouble;
       if( stringToDoubleWithClassicLocale(pieces[i],newDouble) )
       {
          rgba.push_back(newDouble);
       }
       else
       {
           std::string errStr = "Unable to parse component [" + pieces[i] + "] to a double (while parsing a vector value)";
           reportError("","vector4FromString",errStr.c_str());
           return false;
       }
      }
    }

    if (rgba.size() != 4)
    {
        std::string errStr = "Parser found " + intToString(rgba.size())  + " elements but 4 expected while parsing vector [" + vector_str + "]";
        reportError("","vector4FromString",errStr.c_str());
        return false;
    }

    out(0) = rgba[0];
    out(1) = rgba[1];
    out(2) = rgba[2];
    out(3) = rgba[3];

    return true;
}